

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O1

MPP_RET mpp_h263_parser_split(H263dParser ctx,MppPacket dst,MppPacket src)

{
  ushort uVar1;
  RK_U32 RVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  size_t sVar6;
  void *__src;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  MPP_RET MVar12;
  int iVar13;
  uint uVar14;
  size_t __n;
  
  pvVar5 = mpp_packet_get_data(dst);
  sVar6 = mpp_packet_get_length(dst);
  __src = mpp_packet_get_pos(src);
  sVar7 = mpp_packet_get_length(src);
  iVar13 = *(int *)((long)ctx + 0x28);
  uVar11 = *(uint *)((long)ctx + 0x2c);
  RVar2 = mpp_packet_get_eos(src);
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_split");
  }
  uVar14 = (uint)sVar7;
  if ((uVar14 == 0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"src_len",
                 "mpp_h263_parser_split",0x147), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00188d12:
    abort();
  }
  if (sVar6 == 0) {
    uVar9 = 0xffffffff;
  }
  else {
    if ((sVar6 < 4) &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"dst_len >= 4",
                   "mpp_h263_parser_split",0x14a), (mpp_debug._3_1_ & 0x10) != 0))
    goto LAB_00188d12;
    uVar1 = *(ushort *)((long)pvVar5 + (sVar6 - 2));
    uVar9 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  uVar4 = 0;
  if (0 < (int)uVar14 && iVar13 < 0) {
    uVar8 = 0;
    do {
      uVar9 = uVar9 << 8 | (uint)*(byte *)((long)__src + uVar8);
      if (((*(byte *)((long)__src + uVar8) & 0x7c) == 0) && ((uVar9 & 0xffff80) == 0x80)) {
        iVar13 = (int)uVar8 + -2;
        uVar4 = (int)uVar8 + 1;
        break;
      }
      uVar8 = uVar8 + 1;
      uVar4 = uVar14;
    } while ((uVar14 & 0x7fffffff) != uVar8);
  }
  if (-1 < iVar13) {
    if ((int)uVar4 < (int)uVar14) {
      iVar3 = -uVar4;
      pbVar10 = (byte *)((long)(int)uVar4 + (long)__src);
      do {
        uVar9 = uVar9 << 8 | (uint)*pbVar10;
        if (((*pbVar10 & 0x7c) == 0) && ((uVar9 & 0xffff80) == 0x80)) {
          uVar11 = -iVar3 - 2;
          break;
        }
        iVar3 = iVar3 + -1;
        pbVar10 = pbVar10 + 1;
      } while (-uVar14 != iVar3);
      uVar4 = -iVar3;
    }
    if ((RVar2 != 0) && (uVar4 == uVar14)) {
      mpp_packet_set_eos(dst);
      uVar11 = uVar14;
    }
  }
  if ((iVar13 < 0) || ((int)uVar11 < 0)) {
    __n = (size_t)(int)uVar14;
    memcpy((void *)((long)pvVar5 + sVar6),__src,__n);
    mpp_packet_set_length(dst,sVar6 + __n);
    mpp_packet_set_pos(src,(void *)((long)__src + __n));
    MVar12 = MPP_NOK;
  }
  else {
    uVar8 = (ulong)uVar11;
    memcpy((void *)((long)pvVar5 + sVar6),__src,uVar8);
    mpp_packet_set_length(dst,sVar6 + uVar8);
    mpp_packet_set_pos(src,(void *)((long)__src + uVar8));
    sVar6 = mpp_packet_get_length(src);
    if ((uVar14 - uVar11 != (int)sVar6) &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,
                   "(RK_S32)mpp_packet_get_length(src) == (src_len - pos_frm_end)",
                   "mpp_h263_parser_split",0x180), (mpp_debug._3_1_ & 0x10) != 0))
    goto LAB_00188d12;
    mpp_packet_set_length(src,(long)(int)(uVar14 - uVar11));
    MVar12 = MPP_OK;
    iVar13 = -1;
    uVar11 = 0xffffffff;
  }
  *(int *)((long)ctx + 0x28) = iVar13;
  *(uint *)((long)ctx + 0x2c) = uVar11;
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_split");
  }
  return MVar12;
}

Assistant:

MPP_RET mpp_h263_parser_split(H263dParser ctx, MppPacket dst, MppPacket src)
{
    MPP_RET ret = MPP_NOK;
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    RK_U8 *dst_buf = mpp_packet_get_data(dst);
    size_t dst_len = mpp_packet_get_length(dst);
    RK_U8 *src_buf = mpp_packet_get_pos(src);
    RK_S32 src_len = (RK_S32)mpp_packet_get_length(src);
    RK_S32 pos_frm_start = p->pos_frm_start;
    RK_S32 pos_frm_end   = p->pos_frm_end;
    RK_U32 src_eos = mpp_packet_get_eos(src);
    RK_S32 src_pos = 0;
    RK_U32 state = (RK_U32) - 1;

    h263d_dbg_func("in\n");

    mpp_assert(src_len);

    if (dst_len) {
        mpp_assert(dst_len >= 4);
        state = ((RK_U32)(dst_buf[dst_len - 1]) <<  0) |
                ((RK_U32)(dst_buf[dst_len - 2]) <<  8) |
                ((RK_U32)(dst_buf[dst_len - 3]) << 16) |
                ((RK_U32)(dst_buf[dst_len - 4]) << 24);
    }

    if (pos_frm_start < 0) {
        // scan for frame start
        for (src_pos = 0; src_pos < src_len; src_pos++) {
            state = (state << 8) | src_buf[src_pos];
            if ((state & H263_STARTCODE_MASK) == H263_STARTCODE &&
                (state & H263_GOB_ZERO_MASK)  == H263_GOB_ZERO) {
                pos_frm_start = src_pos - 2;
                src_pos++;
                break;
            }
        }
    }

    if (pos_frm_start >= 0) {
        // scan for frame end
        for (; src_pos < src_len; src_pos++) {
            state = (state << 8) | src_buf[src_pos];

            if ((state & H263_STARTCODE_MASK) == H263_STARTCODE &&
                (state & H263_GOB_ZERO_MASK)  == H263_GOB_ZERO) {
                pos_frm_end = src_pos - 2;
                break;
            }
        }
        if (src_eos && src_pos == src_len) {
            pos_frm_end = src_len;
            mpp_packet_set_eos(dst);
        }
    }

    //mpp_log("pkt pos: start %d end %d len: left %d in %d\n",
    //        pos_frm_start, pos_frm_end, dst_len, src_len);

    if (pos_frm_start < 0 || pos_frm_end < 0) {
        // do not found frame start or do not found frame end, just copy the hold buffer to dst
        memcpy(dst_buf + dst_len, src_buf, src_len);
        // update dst buffer length
        mpp_packet_set_length(dst, dst_len + src_len);
        // set src buffer pos to end to src buffer
        mpp_packet_set_pos(src, src_buf + src_len);
    } else {
        // found both frame start and frame end - only copy frame
        memcpy(dst_buf + dst_len, src_buf, pos_frm_end);
        mpp_packet_set_length(dst, dst_len + pos_frm_end);

        // set src buffer pos to end to src buffer
        mpp_packet_set_pos(src, src_buf + pos_frm_end);
        mpp_assert((RK_S32)mpp_packet_get_length(src) == (src_len - pos_frm_end));
        mpp_packet_set_length(src, src_len - pos_frm_end);

        // return ok indicate the frame is ready and reset frame start/end position
        ret = MPP_OK;
        pos_frm_start = -1;
        pos_frm_end = -1;
    }

    p->pos_frm_start = pos_frm_start;
    p->pos_frm_end   = pos_frm_end;

    h263d_dbg_func("out\n");

    return ret;
}